

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers_test.cpp
# Opt level: O1

void __thiscall
BVHLightSampling_OneTri_Test::~BVHLightSampling_OneTri_Test(BVHLightSampling_OneTri_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BVHLightSampling, OneTri) {
    RNG rng(5251);
    Transform id;
    std::vector<int> indices{0, 1, 2};
    // Light is illuminating points with z > 0
    std::vector<Point3f> p{Point3f(-1, -1, 0), Point3f(1, -1, 0), Point3f(0, 1, 0)};
    TriangleMesh mesh(id, false /* rev orientation */, indices, p, {}, {}, {}, {});
    auto tris = Triangle::CreateTriangles(&mesh, Allocator());

    ASSERT_EQ(1, tris.size());
    std::vector<LightHandle> lights;
    ConstantSpectrum one(1.f);
    lights.push_back(new DiffuseAreaLight(id, MediumInterface(), &one, 1.f, tris[0],
                                          Image(), nullptr, false /* two sided */,
                                          Allocator()));

    BVHLightSampler distrib(lights, Allocator());

    for (int i = 0; i < 10; ++i) {
        // Random point in [-5, 5]
        Point3f p(Lerp(rng.Uniform<Float>(), -5, 5), Lerp(rng.Uniform<Float>(), -5, 5),
                  Lerp(rng.Uniform<Float>(), -5, 5));

        Interaction in(p, 0., (MediumHandle) nullptr);
        Point2f u(rng.Uniform<Float>(), rng.Uniform<Float>());
        SampledWavelengths lambda = SampledWavelengths::SampleUniform(0.5);
        LightLiSample ls = lights[0].SampleLi(in, u, lambda);

        pstd::optional<SampledLight> sampledLight =
            distrib.Sample(in, rng.Uniform<Float>());

        // Note that the converse (sampledLight ->
        // ls) isn't always true since the light importance
        // metric is conservative.
        if (!sampledLight) {
            EXPECT_FALSE((bool)ls);
        }
    }
}